

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::namemorestring(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  CAddr CVar1;
  size_type sVar2;
  pointer pcVar3;
  uint uVar4;
  Definition *pDVar5;
  ulong uVar6;
  size_type sVar7;
  
  requireDStackDepth(this,1,"NAME>STRING");
  this_00 = &this->dStack;
  uVar4 = ForthStack<unsigned_int>::getTop(this_00);
  uVar6 = ((long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->definitions).
                 super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  if (uVar6 < uVar4 || uVar6 - uVar4 == 0) {
    ForthStack<unsigned_int>::setTop(this_00,this->VarOffsetWordBuffer);
    uVar4 = 0;
  }
  else {
    pDVar5 = getDefinition(this,uVar4);
    sVar2 = (pDVar5->name)._M_string_length;
    if (sVar2 != 0) {
      pcVar3 = (pDVar5->name)._M_dataplus._M_p;
      CVar1 = this->VarOffsetWordBuffer;
      sVar7 = 0;
      do {
        dataSpaceSet(this,(int)sVar7 + CVar1,pcVar3[sVar7]);
        sVar7 = sVar7 + 1;
      } while (sVar2 != sVar7);
    }
    ForthStack<unsigned_int>::setTop(this_00,this->VarOffsetWordBuffer);
    uVar4 = (uint)(pDVar5->name)._M_string_length;
  }
  ForthStack<unsigned_int>::push(this_00,uVar4);
  return;
}

Assistant:

void namemorestring(){
			REQUIRE_DSTACK_DEPTH(1, "NAME>STRING");
			auto nt=dStack.getTop();
			if(nt>=0 && nt<definitions.size()){
			auto defn=getDefinition(nt);
			auto &name=defn->name;
			moveIntoDataSpace(VarOffsetWordBuffer,name.c_str(),name.size());
			dStack.setTop(VarOffsetWordBuffer);
			dStack.push(CELL(name.size()));
			} else {
				dStack.setTop(VarOffsetWordBuffer);
				dStack.push(0);
			}
		}